

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

int __thiscall astar::Map::At(Map *this,int x,int y)

{
  int iVar1;
  
  iVar1 = 0x7fffffff;
  if (((x < this->m) && (-1 < (y | x))) && (y < this->n)) {
    iVar1 = *(int *)(*(long *)&(this->map).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(uint)x].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    (ulong)(uint)y * 4);
  }
  return iVar1;
}

Assistant:

inline int Map::At(int x, int y)
{
    if (x >= m || y >= n || x < 0 || y < 0) {
        return illegal;
    }
    return map[x][y];
}